

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElements.hpp
# Opt level: O1

void __thiscall ClassBundle::upgradeScopes(ClassBundle *this)

{
  pointer pCVar1;
  pointer pFVar2;
  vector<Class,_std::allocator<Class>_> *__range1;
  Field *field;
  pointer field_00;
  Class *cls;
  pointer pCVar3;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::clear(&(this->unknownClasses)._M_t);
  pCVar1 = (this->allClasses).super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar3 = (this->allClasses).super__Vector_base<Class,_std::allocator<Class>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar3 != pCVar1; pCVar3 = pCVar3 + 1) {
    pFVar2 = (pCVar3->fields).super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (field_00 = (pCVar3->fields).super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                    super__Vector_impl_data._M_start; field_00 != pFVar2; field_00 = field_00 + 1) {
      updateField(this,field_00);
    }
  }
  return;
}

Assistant:

void upgradeScopes() {
        this->unknownClasses.clear();
        for (auto& cls : this->allClasses) {
            for (auto& field : cls.fields) {
                this->updateField(field);
            }
        }

    }